

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool __thiscall
Fossilize::StateReplayer::Impl::parse_mutable_descriptor_type
          (Impl *this,Value *state,VkMutableDescriptorTypeCreateInfoEXT **out_info)

{
  bool bVar1;
  SizeType SVar2;
  SizeType SVar3;
  uint uVar4;
  VkMutableDescriptorTypeCreateInfoEXT *pVVar5;
  Type this_00;
  VkMutableDescriptorTypeListEXT *pVVar6;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *this_01;
  ConstValueIterator pGVar7;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *local_70;
  ConstValueIterator itr;
  VkDescriptorType *desc_types;
  SizeType list_count;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *list;
  uint32_t i;
  VkMutableDescriptorTypeListEXT *out_lists;
  SizeType out_count;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *lists;
  VkMutableDescriptorTypeCreateInfoEXT *info;
  VkMutableDescriptorTypeCreateInfoEXT **out_info_local;
  Value *state_local;
  Impl *this_local;
  
  pVVar5 = ScratchAllocator::allocate_cleared<VkMutableDescriptorTypeCreateInfoEXT>
                     (&this->allocator);
  *out_info = pVVar5;
  bVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::HasMember(state,"mutableDescriptorTypeLists");
  if (bVar1) {
    this_00 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              ::operator[]<char_const>
                        ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                          *)state,"mutableDescriptorTypeLists");
    bVar1 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::Empty(this_00);
    if (!bVar1) {
      SVar2 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::Size(this_00);
      pVVar6 = ScratchAllocator::allocate_n_cleared<VkMutableDescriptorTypeListEXT>
                         (&this->allocator,(ulong)SVar2);
      pVVar5->mutableDescriptorTypeListCount = SVar2;
      pVVar5->pMutableDescriptorTypeLists = pVVar6;
      for (list._4_4_ = 0; list._4_4_ < SVar2; list._4_4_ = list._4_4_ + 1) {
        this_01 = rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::operator[](this_00,list._4_4_);
        SVar3 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::Size(this_01);
        pVVar6[list._4_4_].descriptorTypeCount = SVar3;
        bVar1 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::Empty(this_01);
        if (!bVar1) {
          itr = (ConstValueIterator)
                ScratchAllocator::allocate_n<VkDescriptorType>(&this->allocator,(ulong)SVar3);
          pVVar6[list._4_4_].pDescriptorTypes = (VkDescriptorType *)itr;
          local_70 = rapidjson::
                     GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     ::Begin(this_01);
          for (; pGVar7 = rapidjson::
                          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                          ::End(this_01), local_70 != pGVar7; local_70 = local_70 + 1) {
            uVar4 = rapidjson::
                    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    ::GetUint(local_70);
            (itr->data_).s.length = uVar4;
            itr = (ConstValueIterator)((long)&itr->data_ + 4);
          }
        }
      }
    }
  }
  return true;
}

Assistant:

bool StateReplayer::Impl::parse_mutable_descriptor_type(const Value &state,
                                                        VkMutableDescriptorTypeCreateInfoEXT **out_info)
{
	auto *info = allocator.allocate_cleared<VkMutableDescriptorTypeCreateInfoEXT>();
	*out_info = info;

	if (!state.HasMember("mutableDescriptorTypeLists"))
		return true;

	auto &lists = state["mutableDescriptorTypeLists"];
	if (lists.Empty())
		return true;

	auto out_count = lists.Size();
	auto *out_lists = allocator.allocate_n_cleared<VkMutableDescriptorTypeListEXT>(out_count);

	info->mutableDescriptorTypeListCount = out_count;
	info->pMutableDescriptorTypeLists = out_lists;

	for (uint32_t i = 0; i < out_count; i++)
	{
		auto &list = lists[i];
		auto list_count = list.Size();
		out_lists[i].descriptorTypeCount = list_count;

		if (!list.Empty())
		{
			auto *desc_types = allocator.allocate_n<VkDescriptorType>(list_count);
			out_lists[i].pDescriptorTypes = desc_types;
			for (auto itr = list.Begin(); itr != list.End(); ++itr)
				*desc_types++ = static_cast<VkDescriptorType>(itr->GetUint());
		}
	}

	return true;
}